

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::unsetCursor(QGraphicsItem *this)

{
  undefined1 *puVar1;
  QGraphicsItemPrivate *this_00;
  QGraphicsScene *this_01;
  QWidget *this_02;
  QGraphicsView **ppQVar2;
  QGraphicsItem *pQVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QPoint local_68;
  QPoint local_60;
  QArrayDataPointer<QGraphicsView_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if ((this_00->field_0x161 & 0x80) != 0) {
    QGraphicsItemPrivate::unsetExtra(this_00,ExtraCursor);
    puVar1 = &((this->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffffff7fff;
    this_01 = (QGraphicsScene *)((this->d_ptr).d)->scene;
    if (this_01 != (QGraphicsScene *)0x0) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views((QList<QGraphicsView_*> *)&local_58,this_01);
      ppQVar2 = local_58.ptr;
      lVar4 = local_58.size << 3;
      for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 8) {
        this_02 = *(QWidget **)((long)ppQVar2 + lVar5);
        if ((this_02->data->widget_attributes & 2) != 0) {
          local_68 = (QPoint)QCursor::pos();
          local_60 = QWidget::mapFromGlobal(this_02,&local_68);
          pQVar3 = QGraphicsView::itemAt((QGraphicsView *)this_02,&local_60);
          if (pQVar3 == this) {
            QMetaObject::invokeMethod<>(&this_02->super_QObject,"_q_unsetViewportCursor");
            break;
          }
        }
      }
      QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::unsetCursor()
{
    if (!d_ptr->hasCursor)
        return;
    d_ptr->unsetExtra(QGraphicsItemPrivate::ExtraCursor);
    d_ptr->hasCursor = 0;
    if (d_ptr->scene) {
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            if (view->underMouse() && view->itemAt(view->mapFromGlobal(QCursor::pos())) == this) {
                QMetaObject::invokeMethod(view, "_q_unsetViewportCursor");
                break;
            }
        }
    }
}